

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

bool duckdb::IsCompletionCharacter(char c)

{
  char c_local;
  undefined1 local_1;
  
  if ((c < 'A') || ('Z' < c)) {
    if ((c < 'a') || ('z' < c)) {
      if (c == '_') {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool IsCompletionCharacter(char c) {
	if (c >= 'A' && c <= 'Z') {
		return true;
	}
	if (c >= 'a' && c <= 'z') {
		return true;
	}
	if (c == '_') {
		return true;
	}
	return false;
}